

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O3

void __thiscall cmCommand::SetError(cmCommand *this,string *e)

{
  string *this_00;
  long *local_38 [2];
  long local_28 [2];
  
  (*(this->super_cmObject)._vptr_cmObject[0xc])(local_38,this);
  this_00 = &this->Error;
  std::__cxx11::string::operator=((string *)this_00,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  std::__cxx11::string::append((char *)this_00);
  std::__cxx11::string::_M_append((char *)this_00,(ulong)(e->_M_dataplus)._M_p);
  return;
}

Assistant:

void SetError(const std::string& e)
    {
    this->Error = this->GetName();
    this->Error += " ";
    this->Error += e;
    }